

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O0

Index __thiscall
wasm::(anonymous_namespace)::GlobalTypeOptimization::removeFieldsInInstructions(wasm::Module&)::
FieldRemover::getNewIndex(wasm::HeapType_unsigned_int_(void *this,HeapType type,Index index)

{
  uint uVar1;
  bool bVar2;
  pointer ppVar3;
  reference pvVar4;
  size_type sVar5;
  value_type newIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indexesAfterRemoval;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
  local_30;
  iterator iter;
  Index index_local;
  FieldRemover *this_local;
  HeapType type_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
  ._M_cur._4_4_ = index;
  this_local = (FieldRemover *)type.id;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find((unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               *)(*(long *)((long)this + 0x108) + 0xa0),(key_type *)&this_local);
  indexesAfterRemoval =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       std::
       unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end((unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)(*(long *)((long)this + 0x108) + 0xa0));
  bVar2 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                      *)&indexesAfterRemoval);
  if (bVar2) {
    type_local.id._4_4_ =
         iter.
         super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
         ._M_cur._4_4_;
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
                           *)&local_30);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&ppVar3->second,
                        (ulong)iter.
                               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                               ._M_cur._4_4_);
    uVar1 = *pvVar4;
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&ppVar3->second);
    type_local.id._4_4_ = uVar1;
    if (sVar5 <= uVar1 && uVar1 != 0xffffffff) {
      __assert_fail("newIndex < indexesAfterRemoval.size() || newIndex == RemovedField",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/GlobalTypeOptimization.cpp"
                    ,0x1b4,
                    "Index wasm::(anonymous namespace)::GlobalTypeOptimization::removeFieldsInInstructions(Module &)::FieldRemover::getNewIndex(HeapType, Index)"
                   );
    }
  }
  return type_local.id._4_4_;
}

Assistant:

Index getNewIndex(HeapType type, Index index) {
        auto iter = parent.indexesAfterRemovals.find(type);
        if (iter == parent.indexesAfterRemovals.end()) {
          return index;
        }
        auto& indexesAfterRemoval = iter->second;
        auto newIndex = indexesAfterRemoval[index];
        assert(newIndex < indexesAfterRemoval.size() ||
               newIndex == RemovedField);
        return newIndex;
      }